

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::AnnualTimeZoneRule::isEquivalentTo(AnnualTimeZoneRule *this,TimeZoneRule *other)

{
  bool bVar1;
  UBool UVar2;
  bool local_31;
  AnnualTimeZoneRule *that;
  TimeZoneRule *other_local;
  AnnualTimeZoneRule *this_local;
  
  if (this == (AnnualTimeZoneRule *)other) {
    this_local._7_1_ = '\x01';
  }
  else {
    if (this == (AnnualTimeZoneRule *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    if ((!bVar1) &&
       (UVar2 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other), UVar2 != '\0')) {
      UVar2 = DateTimeRule::operator==
                        (this->fDateTimeRule,(DateTimeRule *)other[1].super_UObject._vptr_UObject);
      local_31 = false;
      if ((UVar2 != '\0') &&
         (local_31 = false,
         this->fStartYear == *(int *)&other[1].fName.super_Replaceable.super_UObject._vptr_UObject))
      {
        local_31 = this->fEndYear ==
                   *(int *)((long)&other[1].fName.super_Replaceable.super_UObject._vptr_UObject + 4)
        ;
      }
      return local_31;
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
AnnualTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    AnnualTimeZoneRule* that = (AnnualTimeZoneRule*)&other;
    return (*fDateTimeRule == *(that->fDateTimeRule) &&
            fStartYear == that->fStartYear &&
            fEndYear == that->fEndYear);
}